

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::allow_config_extras(App *this,bool allow)

{
  bool allow_local;
  App *this_local;
  
  if (allow) {
    this->allow_config_extras_ = capture;
    this->allow_extras_ = true;
  }
  else {
    this->allow_config_extras_ = error;
  }
  return this;
}

Assistant:

App *allow_config_extras(bool allow = true) {
        if(allow) {
            allow_config_extras_ = config_extras_mode::capture;
            allow_extras_ = true;
        } else {
            allow_config_extras_ = config_extras_mode::error;
        }
        return this;
    }